

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

void __thiscall
cmLocalGenerator::AddPositionIndependentFlags
          (cmLocalGenerator *this,string *flags,string *lang,int targetType)

{
  cmMakefile *pcVar1;
  char *pcVar2;
  string *o;
  char *pcVar3;
  string_view arg;
  string picFlags;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  options;
  string sStack_c8;
  char *local_a8;
  size_t local_a0;
  char local_98 [16];
  cmAlphaNum local_88;
  cmAlphaNum local_58;
  
  local_a8 = local_98;
  local_a0 = 0;
  local_98[0] = '\0';
  if (targetType == 0) {
    pcVar1 = this->Makefile;
    local_88.View_._M_len = (size_t)&DAT_00000006;
    local_88.View_._M_str = "CMAKE_";
    local_58.View_._M_str = (lang->_M_dataplus)._M_p;
    local_58.View_._M_len = lang->_M_string_length;
    cmStrCat<char[21]>(&sStack_c8,&local_88,&local_58,(char (*) [21])"_COMPILE_OPTIONS_PIE");
    cmMakefile::GetSafeDefinition(pcVar1,&sStack_c8);
    std::__cxx11::string::_M_assign((string *)&local_a8);
    std::__cxx11::string::~string((string *)&sStack_c8);
    if (local_a0 == 0) goto LAB_00397189;
  }
  else {
LAB_00397189:
    pcVar1 = this->Makefile;
    local_88.View_._M_len = (size_t)&DAT_00000006;
    local_88.View_._M_str = "CMAKE_";
    local_58.View_._M_str = (lang->_M_dataplus)._M_p;
    local_58.View_._M_len = lang->_M_string_length;
    cmStrCat<char[21]>(&sStack_c8,&local_88,&local_58,(char (*) [21])"_COMPILE_OPTIONS_PIC");
    cmMakefile::GetSafeDefinition(pcVar1,&sStack_c8);
    std::__cxx11::string::_M_assign((string *)&local_a8);
    std::__cxx11::string::~string((string *)&sStack_c8);
    if (local_a0 == 0) goto LAB_00397291;
  }
  arg._M_str = local_a8;
  arg._M_len = local_a0;
  cmExpandedList_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_88,arg,false);
  pcVar2 = local_88.View_._M_str;
  for (pcVar3 = (char *)local_88.View_._M_len; pcVar3 != pcVar2; pcVar3 = pcVar3 + 0x20) {
    (*this->_vptr_cmLocalGenerator[8])(this,flags,pcVar3);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_88);
LAB_00397291:
  std::__cxx11::string::~string((string *)&local_a8);
  return;
}

Assistant:

void cmLocalGenerator::AddPositionIndependentFlags(std::string& flags,
                                                   std::string const& lang,
                                                   int targetType)
{
  std::string picFlags;

  if (targetType == cmStateEnums::EXECUTABLE) {
    picFlags = this->Makefile->GetSafeDefinition(
      cmStrCat("CMAKE_", lang, "_COMPILE_OPTIONS_PIE"));
  }
  if (picFlags.empty()) {
    picFlags = this->Makefile->GetSafeDefinition(
      cmStrCat("CMAKE_", lang, "_COMPILE_OPTIONS_PIC"));
  }
  if (!picFlags.empty()) {
    std::vector<std::string> options = cmExpandedList(picFlags);
    for (std::string const& o : options) {
      this->AppendFlagEscape(flags, o);
    }
  }
}